

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemAllocDevicePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,
          ze_device_mem_alloc_desc_t *device_desc,size_t size,size_t alignment,
          ze_device_handle_t hDevice,void **pptr)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (((hDevice != (ze_device_handle_t)0x0 && hContext != (ze_context_handle_t)0x0) &&
      (zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER,
      pptr != (void **)0x0 && device_desc != (ze_device_mem_alloc_desc_t *)0x0)) &&
     (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, device_desc->flags < 8)) {
    if (size == 0) {
      return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;
    }
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;
    if ((alignment & alignment - 1) == 0) {
      zVar1 = ParameterValidation::validateExtensions<_ze_device_mem_alloc_desc_t_const*>
                        (device_desc);
      return zVar1;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemAllocDevicePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_device_mem_alloc_desc_t* device_desc,  ///< [in] pointer to device memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        void** pptr                                     ///< [out] pointer to device allocation
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == device_desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x7 < device_desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0 == size )
            return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;

        if( 0 != (alignment & (alignment - 1)) )
            return ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;

        return ParameterValidation::validateExtensions(device_desc);
    }